

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O2

char * add_file_name_to_url(char *url,char *filename)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  
  pcVar1 = strstr(url,"://");
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar3 = pcVar1 + 3;
    if (pcVar1 == (char *)0x0) {
      pcVar3 = url;
    }
    pcVar3 = strrchr(pcVar3,0x2f);
    pcVar1 = url;
    if ((pcVar3 == (char *)0x0) || (pcVar3[1] == '\0')) {
      pcVar4 = strrchr(filename,0x2f);
      pcVar7 = pcVar4 + 1;
      if (pcVar4 == (char *)0x0) {
        pcVar7 = filename;
        pcVar4 = filename;
      }
      pcVar5 = strrchr(pcVar4,0x5c);
      pcVar4 = pcVar5 + 1;
      if (pcVar5 == (char *)0x0) {
        pcVar4 = pcVar7;
      }
      lVar6 = curl_easy_escape(lVar2,pcVar4,0);
      if (lVar6 != 0) {
        pcVar1 = "%s%s";
        if (pcVar3 == (char *)0x0) {
          pcVar1 = "%s/%s";
        }
        pcVar1 = (char *)curl_maprintf(pcVar1,url,lVar6);
        curl_free(lVar6);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = (char *)0x0;
        }
        else {
          free(url);
        }
      }
    }
    curl_easy_cleanup(lVar2);
  }
  return pcVar1;
}

Assistant:

char *add_file_name_to_url(char *url, const char *filename)
{
  /* If no file name part is given in the URL, we add this file name */
  char *ptr = strstr(url, "://");
  CURL *curl = curl_easy_init(); /* for url escaping */
  if(!curl)
    return NULL; /* error! */
  if(ptr)
    ptr += 3;
  else
    ptr = url;
  ptr = strrchr(ptr, '/');
  if(!ptr || !*++ptr) {
    /* The URL has no file name part, add the local file name. In order
       to be able to do so, we have to create a new URL in another
       buffer.*/

    /* We only want the part of the local path that is on the right
       side of the rightmost slash and backslash. */
    const char *filep = strrchr(filename, '/');
    char *file2 = strrchr(filep?filep:filename, '\\');
    char *encfile;

    if(file2)
      filep = file2 + 1;
    else if(filep)
      filep++;
    else
      filep = filename;

    /* URL encode the file name */
    encfile = curl_easy_escape(curl, filep, 0 /* use strlen */);
    if(encfile) {
      char *urlbuffer;
      if(ptr)
        /* there is a trailing slash on the URL */
        urlbuffer = aprintf("%s%s", url, encfile);
      else
        /* there is no trailing slash on the URL */
        urlbuffer = aprintf("%s/%s", url, encfile);

      curl_free(encfile);

      if(!urlbuffer) {
        url = NULL;
        goto end;
      }

      Curl_safefree(url);
      url = urlbuffer; /* use our new URL instead! */
    }
  }
  end:
  curl_easy_cleanup(curl);
  return url;
}